

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tommyhashlin.h
# Opt level: O0

void * tommy_hashlin_search(tommy_hashlin *hashlin,undefined1 *cmp,void *cmp_arg,tommy_hash_t hash)

{
  long lVar1;
  int iVar2;
  long in_FS_OFFSET;
  tommy_hashlin_node *local_40;
  tommy_hashlin_node *i;
  tommy_hash_t hash_local;
  void *cmp_arg_local;
  undefined1 *cmp_local;
  tommy_hashlin *hashlin_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_40 = tommy_hashlin_bucket(hashlin,hash);
  do {
    if (local_40 == (tommy_hashlin_node *)0x0) {
      hashlin_local = (tommy_hashlin *)0x0;
LAB_001102b1:
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return hashlin_local;
      }
      __stack_chk_fail();
    }
    if (local_40->key == hash) {
      iVar2 = (*(code *)cmp)(cmp_arg,local_40->data);
      if (iVar2 == 0) {
        hashlin_local = (tommy_hashlin *)local_40->data;
        goto LAB_001102b1;
      }
    }
    local_40 = local_40->next;
  } while( true );
}

Assistant:

tommy_inline void* tommy_hashlin_search(tommy_hashlin* hashlin, tommy_search_func* cmp, const void* cmp_arg, tommy_hash_t hash)
{
	tommy_hashlin_node* i = tommy_hashlin_bucket(hashlin, hash);

	while (i) {
		/* we first check if the hash matches, as in the same bucket we may have multiples hash values */
		if (i->key == hash && cmp(cmp_arg, i->data) == 0)
			return i->data;
		i = i->next;
	}
	return 0;
}